

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformfontdatabase.cpp
# Opt level: O1

bool operator!=(QSupportedWritingSystems *lhs,QSupportedWritingSystems *rhs)

{
  bool *pbVar1;
  bool *pbVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  if (lhs->d == rhs->d) {
    return false;
  }
  pbVar1 = (lhs->d->list).d.ptr;
  pbVar2 = (rhs->d->list).d.ptr;
  bVar5 = true;
  if (*pbVar1 == *pbVar2) {
    uVar3 = 0;
    do {
      uVar4 = uVar3;
      if (uVar4 == 0x21) break;
      uVar3 = uVar4 + 1;
    } while (pbVar1[uVar4 + 1] == pbVar2[uVar4 + 1]);
    bVar5 = uVar4 < 0x21;
  }
  return bVar5;
}

Assistant:

bool operator!=(const QSupportedWritingSystems &lhs, const QSupportedWritingSystems &rhs)
{
    if (lhs.d == rhs.d)
        return false;

    Q_ASSERT(lhs.d->list.size() == rhs.d->list.size());
    Q_ASSERT(lhs.d->list.size() == QFontDatabase::WritingSystemsCount);
    for (int i = 0; i < QFontDatabase::WritingSystemsCount; ++i) {
        if (lhs.d->list.at(i) != rhs.d->list.at(i))
            return true;
    }

    return false;
}